

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

__m128i highbd_comp_mask_pred_line_sse2(__m128i s0,__m128i s1,__m128i a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  longlong in_RDX;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar5 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined1 auVar6 [16];
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  __m128i alVar7;
  __m128i s_lo;
  __m128i a_inv;
  __m128i round_const;
  __m128i alpha_max;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined2 local_158;
  undefined2 uStack_156;
  undefined2 uStack_154;
  undefined2 uStack_152;
  undefined2 uStack_150;
  undefined2 uStack_14e;
  undefined2 uStack_14c;
  undefined2 uStack_14a;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  __m128i comp;
  __m128i pred_h;
  __m128i pred_hi;
  __m128i a_hi;
  __m128i s_hi;
  __m128i pred_l;
  __m128i pred_lo;
  __m128i a_lo;
  
  local_158 = (short)in_XMM2_Qa;
  uStack_156 = (short)((ulong)in_XMM2_Qa >> 0x10);
  uStack_154 = (short)((ulong)in_XMM2_Qa >> 0x20);
  uStack_152 = (short)((ulong)in_XMM2_Qa >> 0x30);
  uStack_150 = (short)in_XMM2_Qb;
  uStack_14e = (short)((ulong)in_XMM2_Qb >> 0x10);
  uStack_14c = (short)((ulong)in_XMM2_Qb >> 0x20);
  uStack_14a = (short)((ulong)in_XMM2_Qb >> 0x30);
  local_108 = (undefined2)in_XMM0_Qa;
  uStack_106 = (undefined2)((ulong)in_XMM0_Qa >> 0x10);
  uStack_104 = (undefined2)((ulong)in_XMM0_Qa >> 0x20);
  uStack_102 = (undefined2)((ulong)in_XMM0_Qa >> 0x30);
  local_118 = (undefined2)in_XMM1_Qa;
  uStack_116 = (undefined2)((ulong)in_XMM1_Qa >> 0x10);
  uStack_114 = (undefined2)((ulong)in_XMM1_Qa >> 0x20);
  uStack_112 = (undefined2)((ulong)in_XMM1_Qa >> 0x30);
  auVar2._2_2_ = local_118;
  auVar2._0_2_ = local_108;
  auVar2._4_2_ = uStack_106;
  auVar2._6_2_ = uStack_116;
  auVar2._10_2_ = uStack_114;
  auVar2._8_2_ = uStack_104;
  auVar2._12_2_ = uStack_102;
  auVar2._14_2_ = uStack_112;
  auVar6._2_2_ = 0x40 - local_158;
  auVar6._0_2_ = local_158;
  auVar6._4_2_ = uStack_156;
  auVar6._6_2_ = 0x40 - uStack_156;
  auVar6._10_2_ = 0x40 - uStack_154;
  auVar6._8_2_ = uStack_154;
  auVar6._12_2_ = uStack_152;
  auVar6._14_2_ = 0x40 - uStack_152;
  auVar5 = pmaddwd(auVar2,auVar6);
  local_1a8 = auVar5._0_4_;
  uStack_1a4 = auVar5._4_4_;
  uStack_1a0 = auVar5._8_4_;
  uStack_19c = auVar5._12_4_;
  auVar6 = ZEXT416(6);
  comp[0]._0_2_ = (undefined2)in_XMM0_Qb;
  comp[0]._2_2_ = (undefined2)((ulong)in_XMM0_Qb >> 0x10);
  comp[0]._4_2_ = (undefined2)((ulong)in_XMM0_Qb >> 0x20);
  comp[0]._6_2_ = (undefined2)((ulong)in_XMM0_Qb >> 0x30);
  uStack_90 = (undefined2)in_XMM1_Qb;
  uStack_8e = (undefined2)((ulong)in_XMM1_Qb >> 0x10);
  uStack_8c = (undefined2)((ulong)in_XMM1_Qb >> 0x20);
  uStack_8a = (undefined2)((ulong)in_XMM1_Qb >> 0x30);
  auVar1._2_2_ = uStack_90;
  auVar1._0_2_ = (undefined2)comp[0];
  auVar1._4_2_ = comp[0]._2_2_;
  auVar1._6_2_ = uStack_8e;
  auVar1._10_2_ = uStack_8c;
  auVar1._8_2_ = comp[0]._4_2_;
  auVar1._12_2_ = comp[0]._6_2_;
  auVar1._14_2_ = uStack_8a;
  auVar5._2_2_ = 0x40 - uStack_150;
  auVar5._0_2_ = uStack_150;
  auVar5._4_2_ = uStack_14e;
  auVar5._6_2_ = 0x40 - uStack_14e;
  auVar5._10_2_ = 0x40 - uStack_14c;
  auVar5._8_2_ = uStack_14c;
  auVar5._12_2_ = uStack_14a;
  auVar5._14_2_ = 0x40 - uStack_14a;
  auVar5 = pmaddwd(auVar1,auVar5);
  local_1c8 = auVar5._0_4_;
  uStack_1c4 = auVar5._4_4_;
  uStack_1c0 = auVar5._8_4_;
  uStack_1bc = auVar5._12_4_;
  auVar5 = ZEXT416(6);
  auVar4._4_4_ = uStack_1a4 + 0x20 >> auVar6;
  auVar4._0_4_ = local_1a8 + 0x20 >> auVar6;
  auVar4._12_4_ = uStack_19c + 0x20 >> auVar6;
  auVar4._8_4_ = uStack_1a0 + 0x20 >> auVar6;
  auVar3._4_4_ = uStack_1c4 + 0x20 >> auVar5;
  auVar3._0_4_ = local_1c8 + 0x20 >> auVar5;
  auVar3._12_4_ = uStack_1bc + 0x20 >> auVar5;
  auVar3._8_4_ = uStack_1c0 + 0x20 >> auVar5;
  packssdw(auVar4,auVar3);
  alVar7[1] = in_RDX;
  alVar7[0] = 6;
  return alVar7;
}

Assistant:

static inline __m128i highbd_comp_mask_pred_line_sse2(const __m128i s0,
                                                      const __m128i s1,
                                                      const __m128i a) {
  const __m128i alpha_max = _mm_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i round_const =
      _mm_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m128i a_inv = _mm_sub_epi16(alpha_max, a);

  const __m128i s_lo = _mm_unpacklo_epi16(s0, s1);
  const __m128i a_lo = _mm_unpacklo_epi16(a, a_inv);
  const __m128i pred_lo = _mm_madd_epi16(s_lo, a_lo);
  const __m128i pred_l = _mm_srai_epi32(_mm_add_epi32(pred_lo, round_const),
                                        AOM_BLEND_A64_ROUND_BITS);

  const __m128i s_hi = _mm_unpackhi_epi16(s0, s1);
  const __m128i a_hi = _mm_unpackhi_epi16(a, a_inv);
  const __m128i pred_hi = _mm_madd_epi16(s_hi, a_hi);
  const __m128i pred_h = _mm_srai_epi32(_mm_add_epi32(pred_hi, round_const),
                                        AOM_BLEND_A64_ROUND_BITS);

  const __m128i comp = _mm_packs_epi32(pred_l, pred_h);

  return comp;
}